

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_double(basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            double val,semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  binary_stream_sink *d_first;
  size_t *psVar1;
  pointer psVar2;
  double dVar3;
  
  dVar3 = (double)(float)val;
  d_first = &this->sink_;
  if ((dVar3 != val) || (NAN(dVar3) || NAN(val))) {
    binary_stream_sink::push_back(d_first,0xcb);
    binary::
    native_to_big<double,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (val,(back_insert_iterator<jsoncons::binary_stream_sink>)d_first);
  }
  else {
    binary_stream_sink::push_back(d_first,0xca);
    binary::
    native_to_big<float,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              ((float)val,(back_insert_iterator<jsoncons::binary_stream_sink>)d_first);
  }
  psVar2 = (this->stack_).
           super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::msgpack::basic_msgpack_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start != psVar2) {
    psVar1 = &psVar2[-1].index_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_double(double val, 
            semantic_tag,
            const ser_context&,
            std::error_code&) final
        {
            float valf = (float)val;
            if ((double)valf == val)
            {
                // float 32
                sink_.push_back(jsoncons::msgpack::msgpack_type::float32_type);
                binary::native_to_big(valf,std::back_inserter(sink_));
            }
            else
            {
                // float 64
                sink_.push_back(jsoncons::msgpack::msgpack_type::float64_type);
                binary::native_to_big(val,std::back_inserter(sink_));
            }

            // write double

            end_value();
            JSONCONS_VISITOR_RETURN;
        }